

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

Path * __thiscall
tinyusdz::Path::append_property(Path *__return_storage_ptr__,Path *this,string *elem)

{
  char cVar1;
  bool bVar2;
  
  if (elem->_M_string_length != 0) {
    bVar2 = is_variantElementName(elem);
    if (((!bVar2) && (cVar1 = *(elem->_M_dataplus)._M_p, cVar1 != '.')) && (cVar1 != '[')) {
      ::std::__cxx11::string::_M_assign((string *)&this->_prop_part);
      ::std::__cxx11::string::_M_assign((string *)&this->_element);
      goto LAB_00296667;
    }
  }
  this->_valid = false;
LAB_00296667:
  Path(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append_property(const std::string &elem) {
  Path &p = (*this);

  if (elem.empty()) {
    p._valid = false;
    return p;
  }

  if (is_variantElementName(elem)) {
    // variant chars are not supported yet.
    p._valid = false;
    return p;
  }

  if (elem[0] == '[') {
    // relational attrib are not supported
    p._valid = false;
    return p;
  } else if (elem[0] == '.') {
    // Relative
    // std::cerr << "???. elem[0] is '.'\n";
    // For a while, make this valid.
    p._valid = false;
    return p;
  } else {
    // TODO: Validate property path.
    p._prop_part = elem;
    p._element = elem;

    return p;
  }
}